

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataCollectionWithinCollectionScatter<duckdb::ArrayVector>
               (Vector *child_list,TupleDataVectorFormat *child_list_format,
               SelectionVector *append_sel,idx_t append_count,TupleDataLayout *layout,
               Vector *row_locations,Vector *heap_locations,idx_t col_idx,
               UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  SelectionVector *pSVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  byte bVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_char> *pTVar8;
  long lVar9;
  Vector *pVVar10;
  const_reference pvVar11;
  pointer pCVar12;
  const_reference pvVar13;
  long lVar14;
  ulong uVar15;
  idx_t iVar16;
  idx_t iVar17;
  long *plVar18;
  data_ptr_t pdVar19;
  ulong uVar20;
  data_ptr_t pdVar21;
  _Head_base<0UL,_unsigned_char_*,_false> local_98;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_90;
  unsigned_long local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  Vector *local_60;
  TupleDataLayout *local_58;
  Vector *local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  unsigned_long local_38;
  
  local_60 = child_list;
  local_58 = layout;
  local_50 = row_locations;
  if (append_count != 0) {
    pSVar1 = list_data->sel;
    pdVar19 = list_data->data;
    pSVar2 = (child_list_format->unified).sel;
    pdVar3 = (child_list_format->unified).data;
    pdVar21 = heap_locations->data;
    iVar16 = 0;
    local_48 = pdVar21;
    local_40 = pdVar19;
    do {
      iVar17 = iVar16;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar17 = (idx_t)append_sel->sel_vector[iVar16];
      }
      psVar4 = pSVar1->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar4[iVar17];
      }
      puVar5 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[iVar17 >> 6] >> (iVar17 & 0x3f) & 1) != 0))
         && (*(long *)(pdVar19 + iVar17 * 0x10 + 8) != 0)) {
        plVar18 = (long *)(pdVar19 + iVar17 * 0x10);
        local_98._M_head_impl = *(uchar **)(pdVar21 + iVar16 * 8);
        local_80 = plVar18[1];
        local_90.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_90.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar15 = plVar18[1];
        if (local_98._M_head_impl == (uchar *)0x0) {
          local_38 = local_80;
          make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          p_Var7 = p_Stack_70;
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_78;
          this._M_pi = local_90.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          local_78 = (element_type *)0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
          if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                             (&local_90);
          local_98._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        }
        pdVar21 = local_48;
        if (uVar15 != 0) {
          lVar9 = (uVar15 + 7 >> 3) - 1;
          if (lVar9 != 0) {
            lVar14 = 0;
            do {
              local_98._M_head_impl[lVar14] = 0xff;
              lVar14 = lVar14 + 1;
            } while (lVar9 != lVar14);
          }
          local_98._M_head_impl[lVar9] =
               local_98._M_head_impl[lVar9] | -((uVar15 & 7) == 0) | ~(-1 << ((byte)uVar15 & 7));
        }
        lVar9 = (plVar18[1] + 7U >> 3) + *(long *)(local_48 + iVar16 * 8);
        *(long *)(local_48 + iVar16 * 8) = lVar9 + plVar18[1] * 8;
        if (plVar18[1] != 0) {
          uVar15 = 0;
          do {
            uVar20 = *plVar18 + uVar15;
            psVar4 = pSVar2->sel_vector;
            if (psVar4 != (sel_t *)0x0) {
              uVar20 = (ulong)psVar4[uVar20];
            }
            puVar5 = (child_list_format->unified).validity.
                     super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) {
              *(undefined8 *)(lVar9 + uVar15 * 8) = *(undefined8 *)(pdVar3 + uVar20 * 0x10 + 8);
            }
            else {
              bVar6 = (byte)uVar15 & 7;
              local_98._M_head_impl[uVar15 >> 3] =
                   local_98._M_head_impl[uVar15 >> 3] & (-2 << bVar6 | 0xfeU >> 8 - bVar6);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)plVar18[1]);
        }
        pdVar19 = local_40;
        if (local_90.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          pdVar19 = local_40;
        }
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != append_count);
  }
  pVVar10 = ArrayVector::GetEntry(local_60);
  pvVar11 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](&child_list_format->children,0);
  pCVar12 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
            ::operator->(&pvVar11->combined_list_data);
  pvVar13 = vector<duckdb::TupleDataScatterFunction,_true>::operator[](child_functions,0);
  (*pvVar13->function)
            (pVVar10,pvVar11,append_sel,append_count,local_58,local_50,heap_locations,col_idx,
             &pCVar12->combined_data,&pvVar13->child_functions);
  return;
}

Assistant:

static void TupleDataCollectionWithinCollectionScatter(const Vector &child_list,
                                                       const TupleDataVectorFormat &child_list_format,
                                                       const SelectionVector &append_sel, const idx_t append_count,
                                                       const TupleDataLayout &layout, const Vector &row_locations,
                                                       Vector &heap_locations, const idx_t col_idx,
                                                       const UnifiedVectorFormat &list_data,
                                                       const vector<TupleDataScatterFunction> &child_functions) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &child_list_data = child_list_format.unified;
	const auto &child_list_sel = *child_list_data.sel;
	const auto child_list_entries = UnifiedVectorFormat::GetData<list_entry_t>(child_list_data);
	const auto &child_list_validity = child_list_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child list
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * sizeof(uint64_t);

		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (child_list_validity.RowIsValid(child_list_idx)) {
				const auto &child_list_length = child_list_entries[child_list_idx].length;
				Store<uint64_t>(child_list_length, child_data_location + child_i * sizeof(uint64_t));
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	auto &child_vec = COLLECTION_VECTOR::GetEntry(child_list);
	auto &child_format = child_list_format.children[0];
	auto &combined_child_list_data = child_format.combined_list_data->combined_data;
	const auto &child_function = child_functions[0];
	child_function.function(child_vec, child_format, append_sel, append_count, layout, row_locations, heap_locations,
	                        col_idx, combined_child_list_data, child_function.child_functions);
}